

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O0

void LoadExtByName(char *extensionName)

{
  int iVar1;
  ogl_StrToExtMap *poVar2;
  int numFailed;
  ogl_StrToExtMap *entry;
  char *extensionName_local;
  
  poVar2 = FindExtEntry(extensionName);
  if (poVar2 != (ogl_StrToExtMap *)0x0) {
    if (poVar2->LoadExtension == (PFN_LOADFUNCPOINTERS)0x0) {
      *poVar2->extensionVariable = 1;
    }
    else {
      iVar1 = (*poVar2->LoadExtension)();
      if (iVar1 == 0) {
        *poVar2->extensionVariable = 1;
      }
      else {
        *poVar2->extensionVariable = iVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

static void LoadExtByName(const char *extensionName)
{
	ogl_StrToExtMap *entry = NULL;
	entry = FindExtEntry(extensionName);
	if(entry)
	{
		if(entry->LoadExtension)
		{
			int numFailed = entry->LoadExtension();
			if(numFailed == 0)
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
			}
			else
			{
				*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED + numFailed;
			}
		}
		else
		{
			*(entry->extensionVariable) = ogl_LOAD_SUCCEEDED;
		}
	}
}